

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O3

bool __thiscall
cmCursesStringWidget::HandleInput
          (cmCursesStringWidget *this,int *key,cmCursesMainForm *fm,WINDOW *w)

{
  FORM *form;
  bool bVar1;
  FIELD *pFVar2;
  int iVar3;
  char debugMessage [128];
  allocator<char> local_e1;
  FIELD *local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  char local_b8 [136];
  
  form = (fm->super_cmCursesForm).Form;
  if (((((this->super_cmCursesWidget).field_0x3c == '\0') && (iVar3 = *key, iVar3 != 10)) &&
      (iVar3 != 0x157)) && (iVar3 != 0x69)) {
LAB_0014224c:
    bVar1 = false;
  }
  else {
    this->OriginalString = (char *)0x0;
    this->Done = false;
    do {
      sprintf(local_b8,"String widget handling input, key: %d",(ulong)(uint)*key);
      cmCursesForm::LogMessage(local_b8);
      cmCursesMainForm::PrintKeys(fm,0);
      if (((_stdscr == 0) || (*(short *)(_stdscr + 6) < 0x40)) || (*(short *)(_stdscr + 4) < 5)) {
        if (*key != 0x71) goto LAB_00142071;
        goto LAB_0014224c;
      }
      iVar3 = *key;
      if ((this->super_cmCursesWidget).field_0x3c == '\0') {
        if (((iVar3 == 10) || (iVar3 == 0x157)) || (iVar3 == 0x69)) {
switchD_001420c9_caseD_a:
          (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[8])(this,fm,w);
          goto LAB_0014219c;
        }
        goto LAB_0014224c;
      }
      if (0x101 < iVar3) {
        if (iVar3 < 0x14a) {
          switch(iVar3) {
          case 0x102:
          case 0x103:
            goto switchD_00142064_caseD_102;
          case 0x104:
            goto switchD_00142064_caseD_104;
          case 0x105:
            goto switchD_00142064_caseD_105;
          case 0x106:
            goto switchD_00142064_caseD_106;
          case 0x107:
switchD_00142064_caseD_107:
            local_e0 = current_field(form);
            form_driver(form,0x222);
            pFVar2 = current_field(form);
            if (pFVar2 != local_e0) {
              set_current_field(form,local_e0);
            }
            goto LAB_0014219c;
          }
        }
        else if (iVar3 < 0x157) {
          if (iVar3 == 0x14a) {
            iVar3 = 0x221;
            goto LAB_00142197;
          }
          if (iVar3 - 0x152U < 2) goto switchD_00142064_caseD_102;
        }
        else {
          if (iVar3 == 0x168) goto switchD_001420c9_caseD_5;
          if (iVar3 == 0x157) goto switchD_001420c9_caseD_a;
        }
        goto switchD_00142064_default;
      }
      switch(iVar3) {
      case 1:
switchD_00142064_caseD_106:
        iVar3 = 0x216;
        break;
      case 2:
switchD_00142064_caseD_104:
        iVar3 = 0x211;
        break;
      case 3:
      case 7:
      case 8:
      case 0xc:
      case 0xd:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
        goto switchD_00142064_default;
      case 4:
      case 0xe:
      case 0x10:
      case 0x15:
switchD_00142064_caseD_102:
        (this->super_cmCursesWidget).field_0x3c = 0;
        if (this->OriginalString != (char *)0x0) {
          operator_delete__(this->OriginalString);
        }
        form_driver(form,0x204);
        form_driver(form,0x205);
        goto LAB_0014224c;
      case 5:
switchD_001420c9_caseD_5:
        iVar3 = 0x217;
        break;
      case 6:
switchD_00142064_caseD_105:
        iVar3 = 0x210;
        break;
      case 9:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[7])(this,fm,w);
        goto LAB_0014219c;
      case 10:
        goto switchD_001420c9_caseD_a;
      case 0xb:
        iVar3 = 0x225;
        break;
      case 0x1b:
        (this->super_cmCursesWidget).field_0x3c = 0;
        cmCursesMainForm::PrintKeys(fm,0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_d8,this->OriginalString,&local_e1);
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,(string *)local_d8);
        if (local_d8[0] != local_c8) {
          operator_delete(local_d8[0],local_c8[0] + 1);
        }
        if (this->OriginalString != (char *)0x0) {
          operator_delete__(this->OriginalString);
        }
        if (w == (WINDOW *)0x0) {
          iVar3 = -1;
        }
        else {
          iVar3 = w->_maxy + 1;
        }
        wtouchln(w,0,iVar3,1);
        wrefresh(w);
        goto LAB_001422d6;
      default:
        if (iVar3 == 0x7f) goto switchD_00142064_caseD_107;
        goto switchD_00142064_default;
      }
LAB_00142197:
      form_driver(form,iVar3);
LAB_0014219c:
      if (this->Done == false) {
        if (w == (WINDOW *)0x0) {
          iVar3 = -1;
        }
        else {
          iVar3 = w->_maxy + 1;
        }
        wtouchln(w,0,iVar3,1);
        wrefresh(w);
LAB_00142071:
        iVar3 = wgetch(_stdscr);
        *key = iVar3;
      }
    } while (this->Done == false);
LAB_001422d6:
    bVar1 = true;
  }
  return bVar1;
switchD_00142064_default:
  (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[9])(this,key,fm,w);
  goto LAB_0014219c;
}

Assistant:

bool cmCursesStringWidget::HandleInput(int& key, cmCursesMainForm* fm,
                                       WINDOW* w)
{
  int x, y;

  FORM* form = fm->GetForm();
  // when not in edit mode, edit mode is entered by pressing enter or i (vim
  // binding)
  // 10 == enter
  if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
    return false;
  }

  this->OriginalString = nullptr;
  this->Done = false;

  char debugMessage[128];

  // <Enter> is used to change edit mode (like <Esc> in vi).
  while (!this->Done) {
    sprintf(debugMessage, "String widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    fm->PrintKeys();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        return false;
      }
      key = getch();
      continue;
    }

    // If resize occurred during edit, move out of edit mode
    if (!this->InEdit && (key != 10 && key != KEY_ENTER && key != 'i')) {
      return false;
    }
    // enter edit with return and i (vim binding)
    if (!this->InEdit && (key == 10 || key == KEY_ENTER || key == 'i')) {
      this->OnReturn(fm, w);
    }
    // leave edit with return (but not i -- not a toggle)
    else if (this->InEdit && (key == 10 || key == KEY_ENTER)) {
      this->OnReturn(fm, w);
    } else if (key == KEY_DOWN || key == ctrl('n') || key == KEY_UP ||
               key == ctrl('p') || key == KEY_NPAGE || key == ctrl('d') ||
               key == KEY_PPAGE || key == ctrl('u')) {
      this->InEdit = false;
      delete[] this->OriginalString;
      // trick to force forms to update the field buffer
      form_driver(form, REQ_NEXT_FIELD);
      form_driver(form, REQ_PREV_FIELD);
      return false;
    }
    // esc
    else if (key == 27) {
      if (this->InEdit) {
        this->InEdit = false;
        fm->PrintKeys();
        this->SetString(this->OriginalString);
        delete[] this->OriginalString;
        touchwin(w);
        wrefresh(w);
        return true;
      }
    } else if (key == 9) {
      this->OnTab(fm, w);
    } else if (key == KEY_LEFT || key == ctrl('b')) {
      form_driver(form, REQ_PREV_CHAR);
    } else if (key == KEY_RIGHT || key == ctrl('f')) {
      form_driver(form, REQ_NEXT_CHAR);
    } else if (key == ctrl('k')) {
      form_driver(form, REQ_CLR_EOL);
    } else if (key == ctrl('a') || key == KEY_HOME) {
      form_driver(form, REQ_BEG_FIELD);
    } else if (key == ctrl('e') || key == KEY_END) {
      form_driver(form, REQ_END_FIELD);
    } else if (key == 127 || key == KEY_BACKSPACE) {
      FIELD* cur = current_field(form);
      form_driver(form, REQ_DEL_PREV);
      if (current_field(form) != cur) {
        set_current_field(form, cur);
      }
    } else if (key == ctrl('d') || key == KEY_DC) {
      form_driver(form, REQ_DEL_CHAR);
    } else {
      this->OnType(key, fm, w);
    }
    if (!this->Done) {
      touchwin(w);
      wrefresh(w);

      key = getch();
    }
  }
  return true;
}